

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall Parser::match(Parser *this,TokenType type)

{
  undefined1 local_48 [56];
  
  Token::Token((Token *)local_48,&this->currentToken);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  return local_48._0_4_ == type;
}

Assistant:

bool Parser::match(TokenType type) {
    return token().type == type;
}